

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UChar32 __thiscall icu_63::UnicodeSet::charAt(UnicodeSet *this,int32_t index)

{
  bool bVar1;
  long lVar2;
  UChar32 in_EAX;
  ulong uVar3;
  int iVar4;
  long lVar5;
  UChar32 UVar6;
  int iVar7;
  
  if (-1 < index) {
    uVar3 = (long)this->len & 0xfffffffffffffffe;
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      UVar6 = in_EAX;
      if ((long)uVar3 <= lVar5) break;
      iVar4 = this->list[lVar5];
      iVar7 = this->list[lVar5 + 1] - iVar4;
      UVar6 = iVar4 + index;
      iVar4 = iVar7;
      if (index < iVar7) {
        iVar4 = 0;
      }
      bVar1 = iVar7 <= index;
      lVar2 = lVar5 + 2;
      index = index - iVar4;
    } while (bVar1);
    if (lVar5 < (long)uVar3) {
      return UVar6;
    }
  }
  return -1;
}

Assistant:

UChar32 UnicodeSet::charAt(int32_t index) const {
    if (index >= 0) {
        // len2 is the largest even integer <= len, that is, it is len
        // for even values and len-1 for odd values.  With odd values
        // the last entry is UNICODESET_HIGH.
        int32_t len2 = len & ~1;
        for (int32_t i=0; i < len2;) {
            UChar32 start = list[i++];
            int32_t count = list[i++] - start;
            if (index < count) {
                return (UChar32)(start + index);
            }
            index -= count;
        }
    }
    return (UChar32)-1;
}